

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_crc32(DisasContext_conflict1 *s,arg_rrr *a,_Bool c,MemOp sz)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i32 retval;
  TCGv_i32 ret;
  TCGv_i32 arg3;
  TCGv_i32 t3;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGContext_conflict1 *tcg_ctx;
  MemOp sz_local;
  _Bool c_local;
  arg_rrr *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_crc32(s->isar);
  if (_Var1) {
    retval = load_reg(s,a->rn);
    ret = load_reg(s,a->rm);
    if (sz == MO_8) {
      tcg_gen_ext8u_i32_aarch64(tcg_ctx_00,ret,ret);
    }
    else if (sz == MO_16) {
      tcg_gen_ext16u_i32_aarch64(tcg_ctx_00,ret,ret);
    }
    else if (sz != MO_32) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.c"
                 ,0x217a,(char *)0x0);
    }
    arg3 = tcg_const_i32_aarch64(tcg_ctx_00,1 << ((byte)sz & 0x1f));
    if (c) {
      gen_helper_crc32c(tcg_ctx_00,retval,retval,ret,arg3);
    }
    else {
      gen_helper_crc32(tcg_ctx_00,retval,retval,ret,arg3);
    }
    tcg_temp_free_i32(tcg_ctx_00,ret);
    tcg_temp_free_i32(tcg_ctx_00,arg3);
    store_reg(s,a->rd,retval);
    s_local._7_1_ = true;
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool op_crc32(DisasContext *s, arg_rrr *a, bool c, MemOp sz)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2, t3;

    if (!dc_isar_feature(aa32_crc32, s)) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    switch (sz) {
    case MO_8:
        gen_uxtb(t2);
        break;
    case MO_16:
        gen_uxth(t2);
        break;
    case MO_32:
        break;
    default:
        g_assert_not_reached();
        break;
    }
    t3 = tcg_const_i32(tcg_ctx, 1 << sz);
    if (c) {
        gen_helper_crc32c(tcg_ctx, t1, t1, t2, t3);
    } else {
        gen_helper_crc32(tcg_ctx, t1, t1, t2, t3);
    }
    tcg_temp_free_i32(tcg_ctx, t2);
    tcg_temp_free_i32(tcg_ctx, t3);
    store_reg(s, a->rd, t1);
    return true;
}